

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int equation_system_init(aom_equation_system_t *eqns,int n)

{
  size_t size;
  int iVar1;
  double *pdVar2;
  size_t size_00;
  
  size = (long)n * 8;
  size_00 = size * (long)n;
  pdVar2 = (double *)aom_malloc(size_00);
  eqns->A = pdVar2;
  pdVar2 = (double *)aom_malloc(size);
  eqns->b = pdVar2;
  pdVar2 = (double *)aom_malloc(size);
  eqns->x = pdVar2;
  eqns->n = n;
  if (((eqns->A == (double *)0x0) || (eqns->b == (double *)0x0)) || (pdVar2 == (double *)0x0)) {
    equation_system_init_cold_1();
    iVar1 = 0;
  }
  else {
    memset(eqns->A,0,size_00);
    memset(eqns->x,0,size);
    memset(eqns->b,0,size);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int equation_system_init(aom_equation_system_t *eqns, int n) {
  eqns->A = (double *)aom_malloc(sizeof(*eqns->A) * n * n);
  eqns->b = (double *)aom_malloc(sizeof(*eqns->b) * n);
  eqns->x = (double *)aom_malloc(sizeof(*eqns->x) * n);
  eqns->n = n;
  if (!eqns->A || !eqns->b || !eqns->x) {
    fprintf(stderr, "Failed to allocate system of equations of size %d\n", n);
    aom_free(eqns->A);
    aom_free(eqns->b);
    aom_free(eqns->x);
    memset(eqns, 0, sizeof(*eqns));
    return 0;
  }
  equation_system_clear(eqns);
  return 1;
}